

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

bool ghc::filesystem::exists(path *p,error_code *ec)

{
  error_category *peVar1;
  file_status s;
  uint local_20;
  
  detail::status_ex((path *)&local_20,(error_code *)p,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (local_20 != 0) {
    peVar1 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar1;
  }
  return 1 < local_20;
}

Assistant:

GHC_INLINE bool exists(const path& p, std::error_code& ec) noexcept
{
    file_status s = status(p, ec);
    if (status_known(s)) {
        ec.clear();
    }
    return exists(s);
}